

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bwt_merger.hpp
# Opt level: O0

void __thiscall
bwt_merger<dna_bwt_n<dna_string_n>,_unsigned_short>::save_to_file
          (bwt_merger<dna_bwt_n<dna_string_n>,_unsigned_short> *this,string *base_path)

{
  bool bVar1;
  size_type sVar2;
  unsigned_short *puVar3;
  string *in_RSI;
  long in_RDI;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *this_00;
  reference rVar4;
  reference rVar5;
  ofstream out_2;
  uint8_t c_1;
  uint64_t i_1;
  ofstream out_1;
  char c;
  uint64_t i;
  uint64_t rank1;
  ofstream out;
  string lcp_path;
  string da_path;
  string bwt_path;
  uint64_t in_stack_fffffffffffff8c8;
  dna_bwt_n<dna_string_n> *in_stack_fffffffffffff8d0;
  _Bit_type in_stack_fffffffffffff8e8;
  _Bit_type *in_stack_fffffffffffff8f0;
  char local_701;
  char local_6d8 [512];
  reference local_4d8;
  byte local_4c1;
  ulong local_4c0;
  char local_4b8 [512];
  reference local_2b8;
  reference local_2a8;
  char local_291;
  ulong local_290;
  long local_288;
  char local_280 [512];
  string local_80 [32];
  string local_60 [48];
  string local_30 [48];
  
  std::__cxx11::string::string(local_30,in_RSI);
  std::__cxx11::string::append((char *)local_30);
  std::__cxx11::string::string(local_60,in_RSI);
  std::__cxx11::string::append((char *)local_60);
  std::__cxx11::string::string(local_80,in_RSI);
  std::__cxx11::string::append((char *)local_80);
  std::ofstream::ofstream(local_280,local_30,_S_out);
  rVar5._M_mask = in_stack_fffffffffffff8e8;
  rVar5._M_p = in_stack_fffffffffffff8f0;
  local_288 = 0;
  for (local_290 = 0; local_290 < *(ulong *)(in_RDI + 0x40); local_290 = local_290 + 1) {
    rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((vector<bool,_std::allocator<bool>_> *)rVar5._M_p,rVar5._M_mask);
    local_2a8 = rVar4;
    bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_2a8);
    if (bVar1) {
      local_701 = dna_bwt_n<dna_string_n>::operator[]
                            (in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8);
    }
    else {
      local_701 = dna_bwt_n<dna_string_n>::operator[]
                            (in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8);
    }
    local_291 = local_701;
    std::ostream::write(local_280,(long)&local_291);
    rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((vector<bool,_std::allocator<bool>_> *)rVar5._M_p,rVar5._M_mask);
    local_2b8 = rVar5;
    bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_2b8);
    local_288 = (ulong)bVar1 + local_288;
  }
  std::ofstream::close();
  std::ofstream::~ofstream(local_280);
  if ((*(byte *)(in_RDI + 0x48) & 1) != 0) {
    std::ofstream::ofstream(local_4b8,local_60,_S_out);
    for (local_4c0 = 0; local_4c0 < *(ulong *)(in_RDI + 0x40); local_4c0 = local_4c0 + 1) {
      rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)rVar5._M_p,rVar5._M_mask);
      local_4d8 = rVar4;
      bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_4d8);
      local_4c1 = bVar1 | 0x30;
      std::ostream::write(local_4b8,(long)&local_4c1);
    }
    std::ofstream::close();
    std::ofstream::~ofstream(local_4b8);
  }
  sVar2 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                    ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)(in_RDI + 0x28));
  if (sVar2 != 0) {
    std::ofstream::ofstream(local_6d8,local_80,_S_out);
    this_00 = (vector<unsigned_short,_std::allocator<unsigned_short>_> *)(in_RDI + 0x28);
    puVar3 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::data
                       ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x12b0a9);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(this_00);
    std::ostream::write(local_6d8,(long)puVar3);
    std::ofstream::close();
    std::ofstream::~ofstream(local_6d8);
  }
  std::__cxx11::string::~string(local_80);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void save_to_file(string base_path){

		string bwt_path = base_path;
		bwt_path.append(".bwt");

		string da_path = base_path;
		da_path.append(".da");

		string lcp_path = base_path;
		lcp_path.append(".lcp");

		{
			std::ofstream out(bwt_path);

			uint64_t rank1 = 0;
			for(uint64_t i=0;i<n;++i){

				char c = DA[i]==0 ? bwt1->operator[](i-rank1) : bwt2->operator[](rank1);

				out.write((char*)&c,sizeof(c));

				rank1 += DA[i];

			}
			out.close();
		}

		if(out_da){
			std::ofstream out(da_path);
			for(uint64_t i=0;i<n;++i){

				uint8_t c = DA[i] ? '1' : '0';
				out.write((char*)&c,sizeof(c));

			}
			out.close();
		}

		if(LCP.size()>0){

			std::ofstream out(lcp_path);

			out.write((char*)LCP.data(),LCP.size() * sizeof(lcp_int_t));

			out.close();

		}

	}